

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O1

void ssh1_connection_direction_specific_setup(ssh1_connection_state *s)

{
  mainchan *pmVar1;
  
  if (s->mainchan != (mainchan *)0x0) {
    return;
  }
  pmVar1 = mainchan_new(&s->ppl,&s->cl,s->conf,s->term_width,s->term_height,false,(SshChannel **)0x0
                       );
  s->mainchan = pmVar1;
  return;
}

Assistant:

void ssh1_connection_direction_specific_setup(
    struct ssh1_connection_state *s)
{
    if (!s->mainchan) {
        /*
         * Start up the main session, by telling mainchan.c to do it
         * all just as it would in SSH-2, and translating those
         * concepts to SSH-1's non-channel-shaped idea of the main
         * session.
         */
        s->mainchan = mainchan_new(
            &s->ppl, &s->cl, s->conf, s->term_width, s->term_height,
            false /* is_simple */, NULL);
    }
}